

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O2

iterator * __thiscall
st_tree::detail::
node_raw<st_tree::tree<ut_raw::emplace_subnodes::test_method()::str1,st_tree::raw<st_tree::arg_unused>,std::allocator<ut_raw::emplace_subnodes::test_method()::str1>>,ut_raw::emplace_subnodes::test_method()::str1>
::emplace_insert<int,char_const(&)[2]>
          (iterator *__return_storage_ptr__,void *this,int *args,char (*args_1) [2])

{
  int i;
  long lVar1;
  node_type *n_00;
  tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_> *this_00;
  node_type *n;
  allocator<char> local_81;
  node_type *local_80;
  undefined1 local_78 [40];
  string local_50;
  
  this_00 = (tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_> *)this;
  node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
  ::tree((node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
          *)this);
  n_00 = tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>::_new_node(this_00);
  i = *args;
  local_80 = n_00;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*args_1,&local_81);
  ut_raw::emplace_subnodes::test_method()::str1::str1(int,std::__cxx11::string_
            (local_78,i,&local_50);
  ut_raw::emplace_subnodes::test_method::str1::operator=
            (&(n_00->
              super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
              )._data,(str1 *)local_78);
  std::__cxx11::string::~string((string *)(local_78 + 8));
  std::__cxx11::string::~string((string *)&local_50);
  local_78._0_8_ = 1;
  max_maintainer<unsigned_long,_std::allocator<str1>_>::insert
            (&(n_00->
              super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
              )._depth,(unsigned_long *)local_78);
  std::
  vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
  ::push_back((vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
               *)((long)this + 0x48),&local_80);
  node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
  ::_graft((node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
            *)this,n_00);
  lVar1 = *(long *)((long)this + 0x50);
  __return_storage_ptr__->_vptr_valmap_iterator_adaptor_random =
       (_func_int **)&PTR__valmap_iterator_adaptor_random_002ca5b8;
  (__return_storage_ptr__->_base)._M_current =
       (node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>
        **)(lVar1 + -8);
  return __return_storage_ptr__;
}

Assistant:

iterator emplace_insert(Args&&... args){
        node_type* n = this->tree()._new_node();
        n->_data = data_type(std::forward<Args>(args) ... );
        n->_depth.insert(1);
        this->_children.push_back(n);
        this->_graft(n);
        return iterator(this->_children.begin()+(this->_children.size()-1));
    }